

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update.c
# Opt level: O0

bool do_mob_cast(CHAR_DATA *ch)

{
  bool bVar1;
  short sVar2;
  int iVar3;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var4;
  CHAR_DATA *victim;
  CHAR_DATA *vch;
  short room_occupant;
  short in_room;
  short rnd;
  short sn;
  short i;
  int in_stack_000012c4;
  CHAR_DATA *in_stack_000012c8;
  CHAR_DATA *in_stack_ffffffffffffffb8;
  ulong uVar5;
  undefined8 in_stack_ffffffffffffffc0;
  void *arg1;
  CHAR_DATA *in_stack_ffffffffffffffc8;
  CHAR_DATA *pCVar6;
  CHAR_DATA *local_28;
  short local_1a;
  bool local_1;
  
  local_1a = 0;
  bVar1 = is_npc(in_stack_ffffffffffffffb8);
  if (((bVar1) && (in_RDI->fighting != (CHAR_DATA *)0x0)) &&
     (local_28 = in_stack_ffffffffffffffc8, in_RDI->pIndexData->cast_spell[0] != (char *)0x0)) {
    do {
      iVar3 = number_range((int)in_stack_ffffffffffffffc0,
                           (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    } while (in_RDI->pIndexData->cast_spell[(short)iVar3] == (char *)0x0);
    iVar3 = skill_lookup((char *)local_28);
    sVar2 = (short)iVar3;
    if (sVar2 < 1) {
      local_1 = false;
    }
    else {
      pCVar6 = in_RDI->fighting;
      if (skill_table[sVar2].target == 1) {
        for (pCVar6 = in_RDI->in_room->people; pCVar6 != (CHAR_DATA *)0x0;
            pCVar6 = pCVar6->next_in_room) {
          if (pCVar6 != (CHAR_DATA *)0x0) {
            is_npc(in_stack_ffffffffffffffb8);
          }
        }
        iVar3 = number_range((int)in_stack_ffffffffffffffc0,
                             (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
        for (local_28 = in_RDI->in_room->people; local_28 != (CHAR_DATA *)0x0;
            local_28 = local_28->next_in_room) {
          bVar1 = is_npc(in_stack_ffffffffffffffb8);
          if ((!bVar1) && (local_28->fighting == in_RDI)) {
            local_1a = local_1a + 1;
          }
          if ((short)iVar3 == local_1a) break;
        }
        pCVar6 = local_28;
        if (local_28 == (CHAR_DATA *)0x0) {
          local_28 = in_RDI->fighting;
          pCVar6 = local_28;
        }
      }
      if (skill_table[sVar2].target == 2) {
        pCVar6 = in_RDI;
      }
      arg1 = (void *)in_RDI->act[0];
      _Var4 = std::pow<int,int>(0,0x638666);
      if (((ulong)arg1 & (long)_Var4) == 0) {
        uVar5 = in_RDI->form[0];
        _Var4 = std::pow<int,int>(0,0x638738);
        if ((uVar5 & (long)_Var4) == 0) {
          say_spell(in_stack_000012c8,in_stack_000012c4);
        }
      }
      else if (skill_table[sVar2].target == 2) {
        act((char *)pCVar6,local_28,arg1,in_stack_ffffffffffffffb8,0);
      }
      else {
        act((char *)pCVar6,local_28,arg1,in_stack_ffffffffffffffb8,0);
        act((char *)pCVar6,local_28,arg1,in_stack_ffffffffffffffb8,0);
        act((char *)pCVar6,local_28,arg1,in_stack_ffffffffffffffb8,0);
      }
      (*skill_table[sVar2].spell_fun)((int)sVar2,(int)in_RDI->level,in_RDI,pCVar6,1);
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool do_mob_cast(CHAR_DATA *ch)
{
	short i, sn, rnd, in_room = 0, room_occupant = 0;
	CHAR_DATA *vch, *victim;

	if (!is_npc(ch) || !ch->fighting || ch->pIndexData->cast_spell[0] == nullptr)
		return false;

	for (;;)
	{
		i = number_range(0, 9);
		if (ch->pIndexData->cast_spell[i] != nullptr)
			break;
	}

	sn = skill_lookup(ch->pIndexData->cast_spell[i]);

	if (sn < 1)
		return false;

	victim = ch->fighting;
	// Share the wealth.
	//
	if (skill_table[sn].target == TAR_CHAR_OFFENSIVE)
	{
		for (victim = ch->in_room->people; victim != nullptr; victim = victim->next_in_room)
		{
			if (victim && !is_npc(victim) && victim->fighting && victim->fighting == ch)
				in_room++;
		}

		rnd = number_range(1, in_room);

		for (vch = ch->in_room->people; vch != nullptr; vch = vch->next_in_room)
		{
			if (!is_npc(vch) && vch->fighting == ch)
				room_occupant++;

			if (rnd == room_occupant)
				break;
		}

		victim = vch != nullptr ? vch : ch->fighting;
	}

	if (skill_table[sn].target == TAR_CHAR_DEFENSIVE)
		victim = ch;

	if (IS_SET(ch->act, ACT_CLERIC))
	{
		if (skill_table[sn].target == TAR_CHAR_DEFENSIVE)
		{
			act("$n closes $s eyes with a look of concentration for a moment.", ch, 0, 0, TO_ROOM);
		}
		else
		{
			act("You narrow your eyes and glare in $N's direction.", ch, 0, victim, TO_CHAR);
			act("$n narrows $s eyes and glares in $N's direction.", ch, 0, victim, TO_NOTVICT);
			act("$n narrows $s eyes and glares in your direction.", ch, 0, victim, TO_VICT);
		}
	}
	else if (!IS_SET(ch->form, FORM_NOSPEECH))
	{
		say_spell(ch, sn);
	}

	(*skill_table[sn].spell_fun)(sn, ch->level, ch, victim, TAR_CHAR_OFFENSIVE);

	return true;
}